

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * dirichlet_mix_sample
                   (int comp_num,int elem_num,double *a,double *comp_weight,int *seed,int *comp)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  double *a_00;
  double *pdVar4;
  double *x;
  int elem_i;
  double *a_vec;
  int *comp_local;
  int *seed_local;
  double *comp_weight_local;
  double *a_local;
  int elem_num_local;
  int comp_num_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)elem_num;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  a_00 = (double *)operator_new__(uVar3);
  iVar2 = discrete_sample(comp_num,comp_weight,seed);
  *comp = iVar2;
  for (x._4_4_ = 0; x._4_4_ < elem_num; x._4_4_ = x._4_4_ + 1) {
    a_00[x._4_4_] = a[x._4_4_ + (*comp + -1) * elem_num];
  }
  pdVar4 = dirichlet_sample(elem_num,a_00,seed);
  if (a_00 != (double *)0x0) {
    operator_delete__(a_00);
  }
  return pdVar4;
}

Assistant:

double *dirichlet_mix_sample ( int comp_num, int elem_num, double a[],
  double comp_weight[], int &seed, int *comp )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_SAMPLE samples a Dirichlet mixture PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities for
//    element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int *COMP, the index of the component of the Dirichlet
//    mixture that was chosen to generate the sample.
//
//    Output, double DIRICHLET_MIX_SAMPLE[ELEM_NUM], a sample of the PDF.
//
{
  double *a_vec;
  int elem_i;
  double *x;

  a_vec = new double[elem_num];
//
//  Choose a particular density component COMP.
//
  *comp = discrete_sample ( comp_num, comp_weight, seed );
//
//  Sample the density number COMP.
//
  for ( elem_i = 0; elem_i < elem_num; elem_i++ )
  {
    a_vec[elem_i] = a[elem_i+(*comp-1)*elem_num];
  }

  x = dirichlet_sample ( elem_num, a_vec, seed );

  delete [] a_vec;

  return x;
}